

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<long>::Add(RepeatedField<long> *this,long *value)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  long *in_RSI;
  uint *in_RDI;
  long tmp;
  uint32 size;
  int in_stack_000000cc;
  RepeatedField<long> *in_stack_000000d0;
  
  uVar1 = *in_RDI;
  if (uVar1 == in_RDI[1]) {
    lVar2 = *in_RSI;
    Reserve(in_stack_000000d0,in_stack_000000cc);
    plVar3 = elements(this);
    plVar3[uVar1] = lVar2;
  }
  else {
    lVar2 = *in_RSI;
    plVar3 = elements(this);
    plVar3[uVar1] = lVar2;
  }
  *in_RDI = uVar1 + 1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(const Element& value) {
  uint32 size = current_size_;
  if (static_cast<int>(size) == total_size_) {
    // value could reference an element of the array. Reserving new space will
    // invalidate the reference. So we must make a copy first.
    auto tmp = value;
    Reserve(total_size_ + 1);
    elements()[size] = std::move(tmp);
  } else {
    elements()[size] = value;
  }
  current_size_ = size + 1;
}